

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

int WebRtcAgc_Init(void *agcInst,int32_t minLevel,int32_t maxLevel,int16_t agcMode,uint32_t fs)

{
  int16_t iVar1;
  int32_t iVar2;
  int iVar3;
  LegacyAgc *stt;
  int tmpNorm;
  int16_t i;
  int32_t tmp32;
  int32_t max_add;
  uint32_t fs_local;
  int iStack_1c;
  int16_t agcMode_local;
  int32_t maxLevel_local;
  int32_t minLevel_local;
  void *agcInst_local;
  
  iVar2 = WebRtcAgc_InitDigital((DigitalAgc *)((long)agcInst + 0x198),agcMode);
  if (iVar2 == 0) {
    *(undefined2 *)((long)agcInst + 0x116) = 0;
    if ((agcMode < 0) || (3 < agcMode)) {
      agcInst_local._4_4_ = -1;
    }
    else {
      *(int16_t *)((long)agcInst + 8) = agcMode;
      *(uint32_t *)agcInst = fs;
      WebRtcAgc_InitVad((AgcVad *)((long)agcInst + 0x160));
      iVar1 = NormU32(maxLevel);
      *(int16_t *)((long)agcInst + 0x15c) = iVar1 + -0x17;
      if (*(short *)((long)agcInst + 0x15c) < 0) {
        *(undefined2 *)((long)agcInst + 0x15c) = 0;
      }
      *(undefined2 *)((long)agcInst + 0x15c) = 0;
      fs_local = maxLevel << ((byte)*(undefined2 *)((long)agcInst + 0x15c) & 0x1f);
      iStack_1c = minLevel << ((byte)*(undefined2 *)((long)agcInst + 0x15c) & 0x1f);
      if (*(short *)((long)agcInst + 8) == 2) {
        iStack_1c = 0;
        fs_local = 0xff;
        *(undefined2 *)((long)agcInst + 0x15c) = 0;
      }
      *(int *)((long)agcInst + 0x14c) = iStack_1c;
      *(uint32_t *)((long)agcInst + 0x144) = fs_local;
      *(uint32_t *)((long)agcInst + 0x140) = fs_local + (int)(fs_local - iStack_1c) / 4;
      *(undefined4 *)((long)agcInst + 0x148) = *(undefined4 *)((long)agcInst + 0x140);
      *(undefined4 *)((long)agcInst + 0x154) = *(undefined4 *)((long)agcInst + 0x144);
      *(undefined4 *)((long)agcInst + 0x158) = 0;
      *(undefined4 *)((long)agcInst + 0x13c) = *(undefined4 *)((long)agcInst + 0x144);
      if (*(short *)((long)agcInst + 8) == 2) {
        *(undefined4 *)((long)agcInst + 0x13c) = 0x7f;
      }
      *(undefined4 *)((long)agcInst + 0x130) = *(undefined4 *)((long)agcInst + 0x13c);
      *(undefined4 *)((long)agcInst + 0x138) = 0x7f;
      *(int *)((long)agcInst + 0x150) =
           *(int *)((long)agcInst + 0x14c) +
           ((*(int *)((long)agcInst + 0x140) - *(int *)((long)agcInst + 0x14c)) * 10 >> 8);
      *(undefined2 *)((long)agcInst + 0x11c) = 0;
      *(undefined2 *)((long)agcInst + 0x11e) = 0;
      *(undefined2 *)((long)agcInst + 0x120) = 0;
      *(undefined2 *)((long)agcInst + 0x122) = 0;
      *(undefined2 *)((long)agcInst + 0x124) = 0;
      *(undefined2 *)((long)agcInst + 300) = 0;
      *(undefined2 *)((long)agcInst + 0x134) = 0;
      *(undefined2 *)((long)agcInst + 0x128) = 0x208;
      *(undefined2 *)((long)agcInst + 0x126) = 0x154;
      *(undefined2 *)((long)agcInst + 0x12a) = 0;
      *(undefined4 *)((long)agcInst + 0x70) = 0;
      *(undefined2 *)((long)agcInst + 0x118) = 400;
      *(undefined2 *)((long)agcInst + 0x11a) = 0;
      for (stt._6_2_ = 0; stt._6_2_ < 10; stt._6_2_ = stt._6_2_ + 1) {
        *(undefined4 *)((long)agcInst + (long)stt._6_2_ * 4 + 0x74) = 1000;
      }
      *(undefined4 *)((long)agcInst + 100) = 0x4e2;
      *(undefined2 *)((long)agcInst + 0x114) = 0;
      *(undefined4 *)((long)agcInst + 0x68) = 0x3f9c;
      for (stt._6_2_ = 0; stt._6_2_ < 5; stt._6_2_ = stt._6_2_ + 1) {
        *(undefined4 *)((long)agcInst + (long)stt._6_2_ * 4 + 0x9c) = 0;
      }
      for (stt._6_2_ = 0; stt._6_2_ < 10; stt._6_2_ = stt._6_2_ + 1) {
        *(undefined4 *)((long)agcInst + (long)stt._6_2_ * 4 + 0xc4) = 0;
        *(undefined4 *)((long)agcInst + (long)stt._6_2_ * 4 + 0xec) = 0;
      }
      *(undefined2 *)((long)agcInst + 0x12e) = 0;
      *(undefined8 *)((long)agcInst + 0x4c) = 0;
      *(undefined8 *)((long)agcInst + 0x54) = 0;
      *(undefined8 *)((long)agcInst + 0x3c) = 0;
      *(undefined8 *)((long)agcInst + 0x44) = 0;
      *(undefined2 *)((long)agcInst + 0x18) = 0x2a;
      *(undefined1 *)((long)agcInst + 0x10) = 1;
      *(undefined2 *)((long)agcInst + 0xc) = 3;
      *(undefined2 *)((long)agcInst + 0xe) = 9;
      iVar3 = WebRtcAgc_set_config(agcInst,*(WebRtcAgcConfig *)((long)agcInst + 0xc));
      if (iVar3 == -1) {
        *(undefined2 *)((long)agcInst + 0x1a) = 18000;
        agcInst_local._4_4_ = -1;
      }
      else {
        *(undefined4 *)((long)agcInst + 0x6c) = *(undefined4 *)((long)agcInst + 0x1c);
        *(undefined2 *)((long)agcInst + 0x298) = 0;
        if ((iStack_1c < (int)fs_local) && ((fs_local & 0xfc000000) == 0)) {
          agcInst_local._4_4_ = 0;
        }
        else {
          agcInst_local._4_4_ = -1;
        }
      }
    }
  }
  else {
    *(undefined2 *)((long)agcInst + 0x1a) = 0x4652;
    agcInst_local._4_4_ = -1;
  }
  return agcInst_local._4_4_;
}

Assistant:

int WebRtcAgc_Init(void *agcInst, int32_t minLevel, int32_t maxLevel, int16_t agcMode, uint32_t fs) {
    int32_t max_add, tmp32;
    int16_t i;
    int tmpNorm;
    LegacyAgc *stt;

    /* typecast state pointer */
    stt = (LegacyAgc *) agcInst;

    if (WebRtcAgc_InitDigital(&stt->digitalAgc, agcMode) != 0) {
        stt->lastError = AGC_UNINITIALIZED_ERROR;
        return -1;
    }

    /* Analog AGC variables */
    stt->envSum = 0;

/* mode     = 0 - Only saturation protection
 *            1 - Analog Automatic Gain Control [-targetLevelDbfs (default -3
 * dBOv)]
 *            2 - Digital Automatic Gain Control [-targetLevelDbfs (default -3
 * dBOv)]
 *            3 - Fixed Digital Gain [compressionGaindB (default 8 dB)]
 */
#ifdef WEBRTC_AGC_DEBUG_DUMP
    stt->fcount = 0;
    fprintf(stt->fpt, "AGC->Init\n");
#endif
    if (agcMode < kAgcModeUnchanged || agcMode > kAgcModeFixedDigital) {
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt, "AGC->Init: error, incorrect mode\n\n");
#endif
        return -1;
    }
    stt->agcMode = agcMode;
    stt->fs = fs;

    /* initialize input VAD */
    WebRtcAgc_InitVad(&stt->vadMic);

    /* If the volume range is smaller than 0-256 then
     * the levels are shifted up to Q8-domain */
    tmpNorm = NormU32((uint32_t) maxLevel);
    stt->scale = tmpNorm - 23;
    if (stt->scale < 0) {
        stt->scale = 0;
    }
    // TODO(bjornv): Investigate if we really need to scale up a small range now
    // when we have
    // a guard against zero-increments. For now, we do not support scale up (scale
    // = 0).
    stt->scale = 0;
    maxLevel <<= stt->scale;
    minLevel <<= stt->scale;

    /* Make minLevel and maxLevel static in AdaptiveDigital */
    if (stt->agcMode == kAgcModeAdaptiveDigital) {
        minLevel = 0;
        maxLevel = 255;
        stt->scale = 0;
    }
    /* The maximum supplemental volume range is based on a vague idea
     * of how much lower the gain will be than the real analog gain. */
    max_add = (maxLevel - minLevel) / 4;

    /* Minimum/maximum volume level that can be set */
    stt->minLevel = minLevel;
    stt->maxAnalog = maxLevel;
    stt->maxLevel = maxLevel + max_add;
    stt->maxInit = stt->maxLevel;

    stt->zeroCtrlMax = stt->maxAnalog;
    stt->lastInMicLevel = 0;

    /* Initialize micVol parameter */
    stt->micVol = stt->maxAnalog;
    if (stt->agcMode == kAgcModeAdaptiveDigital) {
        stt->micVol = 127; /* Mid-point of mic level */
    }
    stt->micRef = stt->micVol;
    stt->micGainIdx = 127;
#ifdef MIC_LEVEL_FEEDBACK
    stt->numBlocksMicLvlSat = 0;
    stt->micLvlSat = 0;
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
    fprintf(stt->fpt, "AGC->Init: minLevel = %d, maxAnalog = %d, maxLevel = %d\n", stt->minLevel, stt->maxAnalog,
            stt->maxLevel);
#endif

    /* Minimum output volume is 4% higher than the available lowest volume level
     */
    tmp32 = ((stt->maxLevel - stt->minLevel) * 10) >> 8;
    stt->minOutput = (stt->minLevel + tmp32);

    stt->msTooLow = 0;
    stt->msTooHigh = 0;
    stt->changeToSlowMode = 0;
    stt->firstCall = 0;
    stt->msZero = 0;
    stt->muteGuardMs = 0;
    stt->gainTableIdx = 0;

    stt->msecSpeechInnerChange = kMsecSpeechInner;
    stt->msecSpeechOuterChange = kMsecSpeechOuter;

    stt->activeSpeech = 0;
    stt->Rxx16_LPw32Max = 0;

    stt->vadThreshold = kNormalVadThreshold;
    stt->inActive = 0;

    for (i = 0; i < RXX_BUFFER_LEN; i++) {
        stt->Rxx16_vectorw32[i] = (int32_t) 1000; /* -54dBm0 */
    }
    stt->Rxx160w32 = 125 * RXX_BUFFER_LEN; /* (stt->Rxx16_vectorw32[0]>>3) = 125 */

    stt->Rxx16pos = 0;
    stt->Rxx16_LPw32 = (int32_t) 16284; /* Q(-4) */

    for (i = 0; i < 5; i++) {
        stt->Rxx16w32_array[0][i] = 0;
    }
    for (i = 0; i < 10; i++) {
        stt->env[0][i] = 0;
        stt->env[1][i] = 0;
    }
    stt->inQueue = 0;

#ifdef MIC_LEVEL_FEEDBACK
    stt->targetIdxOffset = 0;
#endif

    memset(stt->filterState, 0, 8 * sizeof(int32_t));

    stt->initFlag = kInitCheck;
    // Default config settings.
    stt->defaultConfig.limiterEnable = kAgcTrue;
    stt->defaultConfig.targetLevelDbfs = AGC_DEFAULT_TARGET_LEVEL;
    stt->defaultConfig.compressionGaindB = AGC_DEFAULT_COMP_GAIN;

    if (WebRtcAgc_set_config(stt, stt->defaultConfig) == -1) {
        stt->lastError = AGC_UNSPECIFIED_ERROR;
        return -1;
    }
    stt->Rxx160_LPw32 = stt->analogTargetLevel;  // Initialize rms value

    stt->lowLevelSignal = 0;

    /* Only positive values are allowed that are not too large */
    if ((minLevel >= maxLevel) || (maxLevel & 0xFC000000)) {
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt, "minLevel, maxLevel value(s) are invalid\n\n");
#endif
        return -1;
    } else {
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt, "\n");
#endif
        return 0;
    }
}